

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AtomVisitor.hpp
# Opt level: O2

void __thiscall
OpenMD::DefaultAtomVisitor::DefaultAtomVisitor(DefaultAtomVisitor *this,SimInfo *info)

{
  BaseAtomVisitor::BaseAtomVisitor(&this->super_BaseAtomVisitor,info);
  (this->super_BaseAtomVisitor).super_BaseVisitor._vptr_BaseVisitor =
       (_func_int **)&PTR__BaseVisitor_00288040;
  std::__cxx11::string::assign((char *)&(this->super_BaseAtomVisitor).super_BaseVisitor.visitorName)
  ;
  return;
}

Assistant:

DefaultAtomVisitor(SimInfo* info) : BaseAtomVisitor(info) {
      visitorName = "DefaultAtomVisitor";
    }